

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testLargeDataWindowOffsets.cpp
# Opt level: O2

ChannelList *
anon_unknown.dwarf_29115f::setupBuffer
          (ChannelList *__return_storage_ptr__,Header *hdr,char **channels,PixelType *pt,
          FrameBuffer *buf,bool writing)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  char *pcVar3;
  Vec2<int> VVar4;
  Vec2<int> VVar5;
  uint uVar6;
  Box2i *pBVar7;
  long lVar8;
  undefined8 *puVar9;
  long lVar10;
  void *ptr;
  long lVar11;
  long lVar12;
  PixelType t;
  long lVar13;
  long lVar14;
  size_t i;
  vector<char,_std::allocator<char>_> *this;
  pointer pcVar15;
  long lVar16;
  undefined1 auVar17 [16];
  int local_a8;
  int iStack_a0;
  Vec2<int> local_78;
  Vec2<int> VStack_70;
  Slice local_68;
  
  pBVar7 = Imf_2_5::Header::dataWindow(hdr);
  VVar4 = pBVar7->min;
  VVar5 = pBVar7->max;
  lVar10 = -1;
  lVar16 = 4;
  do {
    lVar16 = lVar16 + -4;
    lVar12 = lVar10 + 1;
    lVar10 = lVar10 + 1;
  } while (channels[lVar12] != (char *)0x0);
  local_78 = VVar4;
  VStack_70 = VVar5;
  pBVar7 = Imf_2_5::Header::dataWindow(hdr);
  iVar2 = (pBVar7->max).x;
  pBVar7 = Imf_2_5::Header::dataWindow(hdr);
  lVar12 = (long)((iVar2 - (pBVar7->min).x) + 1);
  pBVar7 = Imf_2_5::Header::dataWindow(hdr);
  iVar2 = (pBVar7->max).y;
  pBVar7 = Imf_2_5::Header::dataWindow(hdr);
  lVar13 = (long)((iVar2 - (pBVar7->min).y) + 1);
  this = (vector<char,_std::allocator<char>_> *)&(anonymous_namespace)::readingBuffer;
  if (writing) {
    this = (vector<char,_std::allocator<char>_> *)&(anonymous_namespace)::writingBuffer;
  }
  std::vector<char,_std::allocator<char>_>::resize(this,lVar10 * lVar12 * lVar13 * 4);
  pcVar15 = (this->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
            _M_start;
  lVar11 = 0;
  lVar14 = 0;
  do {
    if (lVar11 == lVar12 * lVar13 * lVar10) {
      (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      p_Var1 = &(__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header;
      (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &p_Var1->_M_header;
      (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           &p_Var1->_M_header;
      (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_a8 = VVar4.x;
      iStack_a0 = VVar5.x;
      lVar12 = (long)((iStack_a0 - local_a8) + 1);
      puVar9 = &(anonymous_namespace)::readingBuffer;
      if (writing) {
        puVar9 = &(anonymous_namespace)::writingBuffer;
      }
      ptr = (void *)*puVar9;
      for (lVar13 = 0; lVar10 != lVar13; lVar13 = lVar13 + 1) {
        t = HALF;
        if (pt != (PixelType *)0x0) {
          t = pt[lVar13];
        }
        pcVar3 = channels[lVar13];
        Imf_2_5::Channel::Channel((Channel *)&local_68,t,1,1,false);
        Imf_2_5::ChannelList::insert(__return_storage_ptr__,pcVar3,(Channel *)&local_68);
        pcVar3 = channels[lVar13];
        auVar17._8_4_ = (int)((ulong)lVar13 >> 0x20);
        auVar17._0_8_ = lVar13;
        auVar17._12_4_ = 0x45300000;
        Imf_2_5::Slice::Make
                  (&local_68,t,ptr,&local_78,lVar12,1,-lVar16,-lVar16 * lVar12,1,1,
                   (auVar17._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar13) - 4503599627370496.0) + 100.0,false,
                   false);
        Imf_2_5::FrameBuffer::insert(buf,pcVar3,&local_68);
        ptr = (void *)((long)ptr + 4);
      }
      return __return_storage_ptr__;
    }
    do {
      uVar6 = random_int(0xffff);
      if ((~uVar6 & 0x7c00) != 0) break;
    } while ((uVar6 & 0x3ff) != 0);
    if ((pt == (PixelType *)0x0) || (pt[lVar14] == HALF)) {
      *(short *)pcVar15 = (short)uVar6;
    }
    else {
      *(undefined4 *)pcVar15 = *(undefined4 *)((long)&half::_toFloat + (ulong)(uVar6 & 0xffff) * 4);
    }
    lVar8 = lVar10 - lVar14;
    lVar14 = lVar14 + 1;
    pcVar15 = pcVar15 + 4;
    if (lVar8 == 1) {
      lVar14 = 0;
    }
    lVar11 = lVar11 + 1;
  } while( true );
}

Assistant:

ChannelList
setupBuffer (const Header& hdr,       // header to grab datawindow from
             const char * const *channels, // NULL terminated list of channels to write
             const PixelType *pt,
             FrameBuffer& buf,        // buffer to fill with pointers to channel
             bool writing                  // true if should allocate
            )
{
    Box2i dw = hdr.dataWindow();

    //
    // how many channels in total
    //
    size_t activechans = 0;
    
    while (channels[activechans]!=NULL)
    {
        activechans++;
    }

    size_t samples = size_t(hdr.dataWindow().max.x+1-hdr.dataWindow().min.x)*
                  size_t(hdr.dataWindow().max.y+1-hdr.dataWindow().min.y)*activechans;

    // always allocate four bytes for each sample, even half types. to keep floats word-aligned
    size_t size =samples * 4;

    
    if (writing)
    {
        writingBuffer.resize(size);
    }
    else
    {
        readingBuffer.resize(size);
    }
   
     const char * write_ptr = writing ? &writingBuffer[0] : &readingBuffer[0];
     // fill with random halfs, casting to floats for float channels - don't write NaN values
     size_t chan=0;
     for (size_t i=0;i<samples;i++)
     {

         half v;
         do
         {
           unsigned short int values = random_int(std::numeric_limits<unsigned short>::max());
           v.setBits(values);
         }
         while ( v.isNan() );

         if (pt==NULL || pt[chan]==IMF::HALF)
         {
             *(half*)write_ptr = half(v);
         }
         else
         {
             *(float*)write_ptr = float(v);
         }
         chan++;
         write_ptr += 4;
         if (chan==activechans)
         {
             chan=0;
         }
        
     }

     

    ChannelList chanlist;

    int64_t width = (dw.max.x+1-dw.min.x);
    int64_t bytes_per_row = activechans * 4 * width;
   
    const char* offset = ( writing ? writingBuffer.data() : readingBuffer.data() ); 
    for (size_t i=0;i<activechans;i++)
    {
        PixelType type = pt==NULL ? IMF::HALF : pt[i];

        chanlist.insert(channels[i],type);
        buf.insert (channels[i],
                    Slice::Make (type,
                                 offset,
                                 dw.min,
                                 width,1,
                                 activechans * 4,
                                 bytes_per_row,
                                 1,
                                 1,
                                 100.+i,false,false
                                )
                    );
        offset += 4;
   }

    return chanlist;
}